

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

bool google::protobuf::internal::
     SplitFieldHasExtraIndirectionStatic<google::protobuf::RepeatedField<long>>
               (FieldDescriptor *field)

{
  bool bVar1;
  LogMessage *pLVar2;
  LogMessage local_28;
  Voidify local_11;
  FieldDescriptor *local_10;
  FieldDescriptor *field_local;
  
  local_10 = field;
  bVar1 = SplitFieldHasExtraIndirection(field);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return true;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.h"
             ,0x65c,"SplitFieldHasExtraIndirection(field)");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_28);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_11,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_28);
}

Assistant:

bool SplitFieldHasExtraIndirectionStatic(const FieldDescriptor* field) {
  if (std::is_base_of<RepeatedFieldBase, T>() ||
      std::is_base_of<RepeatedPtrFieldBase, T>()) {
    ABSL_DCHECK(SplitFieldHasExtraIndirection(field));
    return true;
  } else if (std::is_base_of<MessageLite, T>()) {
    ABSL_DCHECK(!SplitFieldHasExtraIndirection(field));
    return false;
  }
  return SplitFieldHasExtraIndirection(field);
}